

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::on_i2p_open(session_impl *this,error_code *ec)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  string local_38;
  error_code *local_18;
  error_code *ec_local;
  session_impl *this_local;
  
  local_18 = ec;
  ec_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    bVar1 = alert_manager::should_post<libtorrent::i2p_alert>(&this->m_alerts);
    if (bVar1) {
      alert_manager::emplace_alert<libtorrent::i2p_alert,boost::system::error_code_const&>
                (&this->m_alerts,local_18);
    }
    bVar1 = should_log(this);
    if (bVar1) {
      uVar2 = boost::system::error_code::value(local_18);
      boost::system::error_code::message_abi_cxx11_(&local_38,local_18);
      uVar3 = ::std::__cxx11::string::c_str();
      session_log(this,"i2p open failed (%d) %s",(ulong)uVar2,uVar3);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
  }
  open_new_incoming_i2p_connection(this);
  return;
}

Assistant:

void session_impl::on_i2p_open(error_code const& ec)
	{
		if (ec)
		{
			if (m_alerts.should_post<i2p_alert>())
				m_alerts.emplace_alert<i2p_alert>(ec);

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
				session_log("i2p open failed (%d) %s", ec.value(), ec.message().c_str());
#endif
		}
		// now that we have our i2p connection established
		// it's OK to start torrents and use this socket to
		// do i2p name lookups

		open_new_incoming_i2p_connection();
	}